

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_address.cpp
# Opt level: O1

ParseDescriptorResponseStruct *
cfd::js::api::ElementsAddressStructApi::ParseDescriptor
          (ParseDescriptorResponseStruct *__return_storage_ptr__,
          ParseDescriptorRequestStruct *request)

{
  string *in_R8;
  undefined1 local_228 [32];
  _Any_data local_208;
  undefined1 local_1f8 [16];
  vector<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
  local_1e8;
  undefined1 local_1d0 [64];
  string local_190 [32];
  string local_170 [32];
  string asStack_150 [32];
  bool local_130;
  string asStack_128 [32];
  pointer local_108;
  pointer local_100;
  pointer local_f8;
  pointer local_f0;
  pointer local_e8;
  pointer local_e0;
  int local_d8;
  string asStack_d0 [32];
  string asStack_b0 [40];
  _Rb_tree_node_base local_88;
  size_t local_68;
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  ParseDescriptorResponseStruct::ParseDescriptorResponseStruct(__return_storage_ptr__);
  local_228._0_8_ = 0;
  local_228._8_8_ = (pointer)0x0;
  local_228._24_8_ =
       std::
       _Function_handler<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp:257:20)>
       ::_M_invoke;
  local_228._16_8_ =
       std::
       _Function_handler<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp:257:20)>
       ::_M_manager;
  local_208._M_unused._M_object = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"ParseDescriptor","");
  ExecuteStructApi<cfd::js::api::ParseDescriptorRequestStruct,cfd::js::api::ParseDescriptorResponseStruct>
            ((ParseDescriptorResponseStruct *)local_1d0,(api *)request,
             (ParseDescriptorRequestStruct *)local_228,
             (function<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&)>
              *)&local_208,in_R8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1d0);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->address,(string *)(local_1d0 + 0x20));
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->locking_script,local_190);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hash_type,local_170);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->redeem_script,asStack_150);
  __return_storage_ptr__->include_multisig = local_130;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->tree_string,asStack_128);
  local_1e8.
  super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->keys).
       super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1e8.
  super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->keys).
       super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1e8.
  super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->keys).
       super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->keys).
  super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = local_108;
  (__return_storage_ptr__->keys).
  super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_100;
  (__return_storage_ptr__->keys).
  super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_f8;
  local_108 = (pointer)0x0;
  local_100 = (pointer)0x0;
  local_f8 = (pointer)0x0;
  std::
  vector<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
  ::~vector(&local_1e8);
  local_1e8.
  super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(__return_storage_ptr__->scripts).
                super__Vector_base<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_1e8.
  super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(__return_storage_ptr__->scripts).
                super__Vector_base<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_1e8.
  super__Vector_base<cfd::js::api::DescriptorKeyJsonStruct,_std::allocator<cfd::js::api::DescriptorKeyJsonStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(__return_storage_ptr__->scripts).
                super__Vector_base<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->scripts).
  super__Vector_base<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = local_f0;
  (__return_storage_ptr__->scripts).
  super__Vector_base<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_e8;
  (__return_storage_ptr__->scripts).
  super__Vector_base<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_e0;
  local_f0 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_e0 = (pointer)0x0;
  std::
  vector<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
  ::~vector((vector<cfd::js::api::DescriptorScriptJsonStruct,_std::allocator<cfd::js::api::DescriptorScriptJsonStruct>_>
             *)&local_1e8);
  (__return_storage_ptr__->error).code = local_d8;
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->error).type,asStack_d0);
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->error).message,asStack_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if (local_88._M_parent != (_Base_ptr)0x0) {
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_88._M_color;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_88._M_parent;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = local_88._M_left;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_88._M_right;
    (local_88._M_parent)->_M_parent =
         &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_68;
    local_88._M_parent = (_Base_ptr)0x0;
    local_68 = 0;
    local_88._M_left = &local_88;
    local_88._M_right = &local_88;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if (local_58._M_parent != (_Base_ptr)0x0) {
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_58._M_color;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_58._M_parent;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_58._M_left;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_right;
    (local_58._M_parent)->_M_parent =
         &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_38;
    local_58._M_parent = (_Base_ptr)0x0;
    local_38 = 0;
    local_58._M_left = &local_58;
    local_58._M_right = &local_58;
  }
  ParseDescriptorResponseStruct::~ParseDescriptorResponseStruct
            ((ParseDescriptorResponseStruct *)local_1d0);
  if ((undefined1 *)local_208._M_unused._0_8_ != local_1f8) {
    operator_delete(local_208._M_unused._M_object);
  }
  if ((code *)local_228._16_8_ != (code *)0x0) {
    (*(code *)local_228._16_8_)(local_228,local_228,3);
  }
  return __return_storage_ptr__;
}

Assistant:

ParseDescriptorResponseStruct ElementsAddressStructApi::ParseDescriptor(
    const ParseDescriptorRequestStruct& request) {
  auto call_func = [](const ParseDescriptorRequestStruct& request)
      -> ParseDescriptorResponseStruct {  // NOLINT
    NetType net_type = ConvertElementsNetType(request.network);
    ElementsAddressFactory api(net_type);
    return AddressApiBase::ParseDescriptor(request, &api);
  };

  ParseDescriptorResponseStruct result;
  result = ExecuteStructApi<
      ParseDescriptorRequestStruct, ParseDescriptorResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}